

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O3

void cmime_message_prepend_subject(CMimeMessage_T *message,char *s)

{
  char *pcVar1;
  char *local_30;
  char *new_subject;
  
  local_30 = (char *)0x0;
  pcVar1 = _cmime_internal_get_linked_header_value(message->headers,"Subject");
  asprintf(&local_30,"%s %s",s,pcVar1);
  _cmime_internal_set_linked_header_value(message->headers,"Subject",local_30);
  if (local_30 != (char *)0x0) {
    free(local_30);
  }
  return;
}

Assistant:

void cmime_message_prepend_subject(CMimeMessage_T *message, const char *s) {
    char *orig_subject = NULL;
    char *new_subject = NULL;

    orig_subject = cmime_message_get_subject(message);
    asprintf(&new_subject, "%s %s", s, orig_subject);
    cmime_message_set_subject(message, new_subject);
    if(new_subject != NULL)
        free(new_subject);
}